

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::CreateObjectLists
          (cmMakefileTargetGenerator *this,bool useLinkScript,bool useArchiveRules,
          bool useResponseFile,string *buildObjs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,bool useWatcomQuote)

{
  string *this_00;
  uint uVar1;
  string responseFlagVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  object_strings;
  char rsp [32];
  string variableNameExternal;
  string variableName;
  string objects_rsp;
  string local_50;
  
  variableName._M_dataplus._M_p = (pointer)&variableName.field_2;
  variableName._M_string_length = 0;
  variableName.field_2._M_local_buf[0] = '\0';
  variableNameExternal._M_dataplus._M_p = (pointer)&variableNameExternal.field_2;
  variableNameExternal._M_string_length = 0;
  variableNameExternal.field_2._M_local_buf[0] = '\0';
  WriteObjectsVariable(this,&variableName,&variableNameExternal,useWatcomQuote);
  if (useResponseFile) {
    object_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    object_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    object_strings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    WriteObjectsStrings(this,&object_strings,0x1ffb8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&responseFlagVar,"CMAKE_",(allocator<char> *)rsp);
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)rsp,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               &(this->super_cmCommonTargetGenerator).ConfigName);
    std::__cxx11::string::append((string *)&responseFlagVar);
    std::__cxx11::string::~string((string *)rsp);
    std::__cxx11::string::append((char *)&responseFlagVar);
    cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&responseFlagVar);
    for (uVar1 = 1;
        (ulong)(uVar1 - 1) <
        (ulong)((long)object_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)object_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
      sprintf(rsp,"objects%u.rsp",(ulong)uVar1);
      CreateResponseFile(&objects_rsp,this,rsp,
                         object_strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (uVar1 - 1),makefile_depends);
      std::__cxx11::string::append((char *)buildObjs);
      std::__cxx11::string::append((char *)buildObjs);
      cmOutputConverter::ConvertToOutputFormat
                (&local_50,
                 &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&objects_rsp,SHELL);
      std::__cxx11::string::append((string *)buildObjs);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&objects_rsp);
    }
    std::__cxx11::string::~string((string *)&responseFlagVar);
    this_00 = (string *)&object_strings;
  }
  else {
    if (!useLinkScript) {
      std::__cxx11::string::assign((char *)buildObjs);
      std::__cxx11::string::append((string *)buildObjs);
      std::__cxx11::string::append((char *)buildObjs);
      std::__cxx11::string::append((string *)buildObjs);
      std::__cxx11::string::append((char *)buildObjs);
      goto LAB_002af2f2;
    }
    if (useArchiveRules) goto LAB_002af2f2;
    responseFlagVar._M_dataplus._M_p = (pointer)0x0;
    responseFlagVar._M_string_length = 0;
    responseFlagVar.field_2._M_allocated_capacity = 0;
    WriteObjectsStrings(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&responseFlagVar,0xffffffffffffffff);
    std::__cxx11::string::_M_assign((string *)buildObjs);
    this_00 = &responseFlagVar;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
LAB_002af2f2:
  std::__cxx11::string::~string((string *)&variableNameExternal);
  std::__cxx11::string::~string((string *)&variableName);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateObjectLists(
  bool useLinkScript, bool useArchiveRules, bool useResponseFile,
  std::string& buildObjs, std::vector<std::string>& makefile_depends,
  bool useWatcomQuote)
{
  std::string variableName;
  std::string variableNameExternal;
  this->WriteObjectsVariable(variableName, variableNameExternal,
                             useWatcomQuote);
  if (useResponseFile) {
    // MSVC response files cannot exceed 128K.
    std::string::size_type const responseFileLimit = 131000;

    // Construct the individual object list strings.
    std::vector<std::string> object_strings;
    this->WriteObjectsStrings(object_strings, responseFileLimit);

    // Lookup the response file reference flag.
    std::string responseFlagVar = "CMAKE_";
    responseFlagVar +=
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    responseFlagVar += "_RESPONSE_FILE_LINK_FLAG";
    const char* responseFlag = this->Makefile->GetDefinition(responseFlagVar);
    if (!responseFlag) {
      responseFlag = "@";
    }

    // Write a response file for each string.
    const char* sep = "";
    for (unsigned int i = 0; i < object_strings.size(); ++i) {
      // Number the response files.
      char rsp[32];
      sprintf(rsp, "objects%u.rsp", i + 1);

      // Create this response file.
      std::string objects_rsp =
        this->CreateResponseFile(rsp, object_strings[i], makefile_depends);

      // Separate from previous response file references.
      buildObjs += sep;
      sep = " ";

      // Reference the response file.
      buildObjs += responseFlag;
      buildObjs += this->LocalGenerator->ConvertToOutputFormat(
        objects_rsp, cmOutputConverter::SHELL);
    }
  } else if (useLinkScript) {
    if (!useArchiveRules) {
      std::vector<std::string> objStrings;
      this->WriteObjectsStrings(objStrings);
      buildObjs = objStrings[0];
    }
  } else {
    buildObjs = "$(";
    buildObjs += variableName;
    buildObjs += ") $(";
    buildObjs += variableNameExternal;
    buildObjs += ")";
  }
}